

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O2

void * slab_map(slab_arena *arena)

{
  size_t *psVar1;
  size_t sVar2;
  uint uVar3;
  quota *pqVar4;
  void *ptr;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  ptr = lf_lifo_pop(&arena->cache);
  if (ptr == (void *)0x0) {
    uVar3 = arena->slab_size;
    if ((ulong)uVar3 == 0) {
      __assert_fail("size_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x89,"ssize_t quota_use(struct quota *, size_t)");
    }
    pqVar4 = arena->quota;
    do {
      uVar6 = pqVar4->value;
      uVar5 = (uint)uVar6 + (int)((ulong)uVar3 + 0x3ff >> 10);
      if (uVar5 <= (uint)uVar6) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      if ((uint)(uVar6 >> 0x20) < uVar5) {
        return (void *)0x0;
      }
      LOCK();
      bVar7 = uVar6 == pqVar4->value;
      if (bVar7) {
        pqVar4->value = (ulong)uVar5 | uVar6 & 0xffffffff00000000;
      }
      UNLOCK();
    } while (!bVar7);
    LOCK();
    psVar1 = &arena->used;
    sVar2 = *psVar1;
    *psVar1 = *psVar1 + (ulong)arena->slab_size;
    UNLOCK();
    uVar6 = (ulong)arena->slab_size;
    if (arena->prealloc < sVar2 + uVar6) {
      ptr = mmap_checked(uVar6,uVar6,arena->flags);
      if (ptr == (void *)0x0) {
        LOCK();
        arena->used = arena->used - (ulong)arena->slab_size;
        UNLOCK();
        uVar3 = arena->slab_size;
        if ((ulong)uVar3 == 0) {
          __assert_fail("size_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
        }
        pqVar4 = arena->quota;
        do {
          uVar6 = pqVar4->value;
          uVar5 = (uint)((ulong)uVar3 + 0x3ff >> 10);
          if ((uint)uVar6 < uVar5) {
            __assert_fail("size_in_units <= used_in_units",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                          ,0xab,"ssize_t quota_release(struct quota *, size_t)");
          }
          LOCK();
          bVar7 = uVar6 == pqVar4->value;
          if (bVar7) {
            pqVar4->value = (ulong)((uint)uVar6 - uVar5) | uVar6 & 0xffffffff00000000;
          }
          UNLOCK();
        } while (!bVar7);
      }
      madvise_checked(ptr,(ulong)arena->slab_size,arena->flags);
    }
    else {
      ptr = (void *)(sVar2 + (long)arena->arena);
    }
  }
  return ptr;
}

Assistant:

void *
slab_map(struct slab_arena *arena)
{
	void *ptr;
	if ((ptr = lf_lifo_pop(&arena->cache))) {
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	if (quota_use(arena->quota, arena->slab_size) < 0)
		return NULL;

	/** Need to allocate a new slab. */
	size_t used = pm_atomic_fetch_add(&arena->used, arena->slab_size);
	used += arena->slab_size;
	if (used <= arena->prealloc) {
		ptr = arena->arena + used - arena->slab_size;
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	ptr = mmap_checked(arena->slab_size, arena->slab_size,
			   arena->flags);
	if (!ptr) {
		__sync_sub_and_fetch(&arena->used, arena->slab_size);
		quota_release(arena->quota, arena->slab_size);
	}

	madvise_checked(ptr, arena->slab_size, arena->flags);

	VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
	return ptr;
}